

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O1

int read_yuv_frame(AvxInputContext *input_ctx,aom_image_t *yuv_frame)

{
  size_t *psVar1;
  aom_img_fmt_t aVar2;
  aom_img_fmt_t aVar3;
  FILE *__stream;
  size_t sVar4;
  int iVar5;
  int iVar6;
  uchar **ppuVar7;
  size_t sVar8;
  ulong __n;
  ulong uVar9;
  int plane;
  ulong __n_00;
  long lVar10;
  uchar *__dest;
  bool bVar11;
  uint local_64;
  
  __stream = (FILE *)input_ctx->file;
  aVar2 = yuv_frame->fmt;
  lVar10 = 0;
  local_64 = 0;
  do {
    plane = (int)lVar10;
    iVar5 = aom_img_plane_width(yuv_frame,plane);
    iVar6 = aom_img_plane_height(yuv_frame,plane);
    aVar3 = yuv_frame->fmt;
    bVar11 = lVar10 != 2;
    if (bVar11 || aVar3 != AOM_IMG_FMT_NV12) {
      if (plane == 2) {
        ppuVar7 = yuv_frame->planes + (ulong)(aVar3 != AOM_IMG_FMT_YV12) + 1;
      }
      else if (plane == 1) {
        ppuVar7 = yuv_frame->planes + (ulong)(aVar3 == AOM_IMG_FMT_YV12) + 1;
      }
      else {
        ppuVar7 = yuv_frame->planes + lVar10;
      }
      if (0 < iVar6) {
        __dest = *ppuVar7;
        uVar9 = (ulong)((iVar5 << (lVar10 == 1 && aVar3 == AOM_IMG_FMT_NV12)) <<
                       ((byte)(aVar2 >> 0xb) & 1));
        do {
          sVar4 = (input_ctx->detect).position;
          __n = (input_ctx->detect).buf_read - sVar4;
          if (__n == 0) {
            __n = 0;
            __n_00 = uVar9;
          }
          else {
            if (uVar9 <= __n) {
              __n = uVar9;
            }
            memcpy(__dest,(input_ctx->detect).buf + sVar4,__n);
            __n_00 = uVar9 - __n;
            psVar1 = &(input_ctx->detect).position;
            *psVar1 = *psVar1 + __n;
          }
          if (__n_00 != 0) {
            sVar8 = fread(__dest + __n,1,__n_00,__stream);
            local_64 = local_64 | sVar8 < __n_00;
          }
          __dest = __dest + yuv_frame->stride[lVar10];
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
    }
    lVar10 = lVar10 + 1;
  } while ((bVar11 || aVar3 != AOM_IMG_FMT_NV12) && lVar10 != 3);
  return local_64;
}

Assistant:

int read_yuv_frame(struct AvxInputContext *input_ctx, aom_image_t *yuv_frame) {
  FILE *f = input_ctx->file;
  struct FileTypeDetectionBuffer *detect = &input_ctx->detect;
  int plane = 0;
  int shortread = 0;
  const int bytespp = (yuv_frame->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1;

  for (plane = 0; plane < 3; ++plane) {
    uint8_t *ptr;
    int w = aom_img_plane_width(yuv_frame, plane);
    const int h = aom_img_plane_height(yuv_frame, plane);
    int r;
    // Assuming that for nv12 we read all chroma data at once
    if (yuv_frame->fmt == AOM_IMG_FMT_NV12 && plane > 1) break;
    if (yuv_frame->fmt == AOM_IMG_FMT_NV12 && plane == 1) w *= 2;
    /* Determine the correct plane based on the image format. The for-loop
     * always counts in Y,U,V order, but this may not match the order of
     * the data on disk.
     */
    switch (plane) {
      case 1:
        ptr =
            yuv_frame->planes[yuv_frame->fmt == AOM_IMG_FMT_YV12 ? AOM_PLANE_V
                                                                 : AOM_PLANE_U];
        break;
      case 2:
        ptr =
            yuv_frame->planes[yuv_frame->fmt == AOM_IMG_FMT_YV12 ? AOM_PLANE_U
                                                                 : AOM_PLANE_V];
        break;
      default: ptr = yuv_frame->planes[plane];
    }

    for (r = 0; r < h; ++r) {
      size_t needed = w * bytespp;
      size_t buf_position = 0;
      const size_t left = detect->buf_read - detect->position;
      if (left > 0) {
        const size_t more = (left < needed) ? left : needed;
        memcpy(ptr, detect->buf + detect->position, more);
        buf_position = more;
        needed -= more;
        detect->position += more;
      }
      if (needed > 0) {
        shortread |= (fread(ptr + buf_position, 1, needed, f) < needed);
      }

      ptr += yuv_frame->stride[plane];
    }
  }

  return shortread;
}